

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_memset(void *ptr,int c0,nk_size size)

{
  undefined1 uVar1;
  uint uVar2;
  ulong uVar3;
  uint *puVar4;
  ulong local_38;
  nk_size t;
  uint *puStack_28;
  uint c;
  nk_byte *dst;
  nk_size size_local;
  int c0_local;
  void *ptr_local;
  
  t._4_4_ = c0 & 0xff;
  if (t._4_4_ != 0) {
    uVar2 = t._4_4_ << 8 | t._4_4_;
    t._4_4_ = uVar2 << 0x10 | uVar2;
  }
  uVar1 = (undefined1)c0;
  puStack_28 = (uint *)ptr;
  dst = (nk_byte *)size;
  if (size < 0xc) {
    while (dst != (nk_byte *)0x0) {
      *(undefined1 *)puStack_28 = uVar1;
      puStack_28 = (uint *)((long)puStack_28 + 1);
      dst = dst + -1;
    }
  }
  else {
    puStack_28 = (uint *)ptr;
    if (((ulong)ptr & 3) != 0) {
      local_38 = 4 - ((ulong)ptr & 3);
      dst = (nk_byte *)(size - local_38);
      puStack_28 = (uint *)ptr;
      do {
        puVar4 = (uint *)((long)puStack_28 + 1);
        *(undefined1 *)puStack_28 = uVar1;
        local_38 = local_38 + -1;
        puStack_28 = puVar4;
      } while (local_38 != 0);
    }
    local_38 = (ulong)dst >> 2;
    do {
      *puStack_28 = t._4_4_;
      puStack_28 = puStack_28 + 1;
      local_38 = local_38 - 1;
    } while (local_38 != 0);
    for (uVar3 = (ulong)dst & 3; uVar3 != 0; uVar3 = uVar3 - 1) {
      *(undefined1 *)puStack_28 = uVar1;
      puStack_28 = (uint *)((long)puStack_28 + 1);
    }
  }
  return;
}

Assistant:

NK_LIB void
nk_memset(void *ptr, int c0, nk_size size)
{
    #define nk_word unsigned
    #define nk_wsize sizeof(nk_word)
    #define nk_wmask (nk_wsize - 1)
    nk_byte *dst = (nk_byte*)ptr;
    unsigned c = 0;
    nk_size t = 0;

    if ((c = (nk_byte)c0) != 0) {
        c = (c << 8) | c; /* at least 16-bits  */
        if (sizeof(unsigned int) > 2)
            c = (c << 16) | c; /* at least 32-bits*/
    }

    /* too small of a word count */
    dst = (nk_byte*)ptr;
    if (size < 3 * nk_wsize) {
        while (size--) *dst++ = (nk_byte)c0;
        return;
    }

    /* align destination */
    if ((t = NK_PTR_TO_UINT(dst) & nk_wmask) != 0) {
        t = nk_wsize -t;
        size -= t;
        do {
            *dst++ = (nk_byte)c0;
        } while (--t != 0);
    }

    /* fill word */
    t = size / nk_wsize;
    do {
        *(nk_word*)((void*)dst) = c;
        dst += nk_wsize;
    } while (--t != 0);

    /* fill trailing bytes */
    t = (size & nk_wmask);
    if (t != 0) {
        do {
            *dst++ = (nk_byte)c0;
        } while (--t != 0);
    }

    #undef nk_word
    #undef nk_wsize
    #undef nk_wmask
}